

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int local_d8 [3];
  tuple<int,_int,_int,_int> local_cc;
  undefined4 local_bc;
  int local_b8 [2];
  undefined4 local_b0;
  int local_ac [4];
  undefined4 local_9c;
  int local_98;
  tuple<int,_int,_int,_int> local_94;
  undefined4 local_84;
  int local_80 [3];
  tuple<int,_int,_int,_int> local_74;
  undefined4 local_64;
  int local_60;
  int local_5c [2];
  undefined4 local_54;
  int local_50;
  tuple<int,_int> local_4c;
  tuple<int,_int,_int,_int> local_44;
  undefined4 local_34;
  int local_30;
  tuple<int,_int> local_2c;
  undefined4 local_24;
  int local_20;
  int local_1c [2];
  tuple<int,_int> local_14;
  int local_c;
  
  local_c = 0;
  local_20 = 1;
  local_24 = 2;
  std::make_tuple<int,int>(local_1c,&local_20);
  concat<std::tuple<int,int>>(&local_14);
  local_30 = 1;
  local_34 = 2;
  std::make_tuple<int,int>((int *)&local_2c,&local_30);
  bVar1 = std::operator==(&local_14,&local_2c);
  if (!bVar1) {
    __assert_fail("concat(make_tuple(1, 2)) == make_tuple(1, 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/aherrmann[P]unpacking_tuples_examples/example5.cpp"
                  ,0x4a,"int main()");
  }
  local_50 = 1;
  local_54 = 2;
  std::make_tuple<int,int>((int *)&local_4c,&local_50);
  local_60 = 3;
  local_64 = 4;
  std::make_tuple<int,int>(local_5c,&local_60);
  concat<std::tuple<int,int>,std::tuple<int,int>>((tuple<int,_int> *)&local_44,&local_4c);
  local_80[2] = 1;
  local_80[1] = 2;
  local_80[0] = 3;
  local_84 = 4;
  std::make_tuple<int,int,int,int>((int *)&local_74,local_80 + 2,local_80 + 1,local_80);
  bVar1 = std::operator==(&local_44,&local_74);
  if (!bVar1) {
    __assert_fail("concat(make_tuple(1, 2), make_tuple(3, 4)) == make_tuple(1, 2, 3, 4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/aherrmann[P]unpacking_tuples_examples/example5.cpp"
                  ,0x4c,"int main()");
  }
  local_9c = 1;
  std::make_tuple<int>(&local_98);
  std::make_tuple<>();
  local_ac[1] = 2;
  std::make_tuple<int>(local_ac + 2);
  local_b0 = 3;
  std::make_tuple<int>(local_ac);
  std::make_tuple<>();
  local_bc = 4;
  std::make_tuple<int>(local_b8);
  concat<std::tuple<int>,std::tuple<>,std::tuple<int>,std::tuple<int>,std::tuple<>,std::tuple<int>>
            (&local_94,&local_98,local_ac + 2,local_ac,local_b8);
  local_d8[2] = 1;
  local_d8[1] = 2;
  local_d8[0] = 3;
  std::make_tuple<int,int,int,int>((int *)&local_cc,local_d8 + 2,local_d8 + 1,local_d8);
  bVar1 = std::operator==(&local_94,&local_cc);
  if (!bVar1) {
    __assert_fail("concat(make_tuple(1), make_tuple(), make_tuple(2), make_tuple(3), make_tuple(), make_tuple(4)) == make_tuple(1, 2, 3, 4)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/aherrmann[P]unpacking_tuples_examples/example5.cpp"
                  ,0x50,"int main()");
  }
  return local_c;
}

Assistant:

int main() {
    assert(concat() == make_tuple());
    assert(concat(make_tuple(1, 2)) == make_tuple(1, 2));
    assert(concat(make_tuple(1, 2), make_tuple(3, 4)) ==
           make_tuple(1, 2, 3, 4));
    assert(concat(make_tuple(1), make_tuple(),
                  make_tuple(2), make_tuple(3),
                  make_tuple(),
                  make_tuple(4)) == make_tuple(1, 2, 3, 4));
}